

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_array_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  lVar2 = 8;
  for (uVar3 = 0; uVar3 < *(uint *)((long)val.u.ptr + 0x40); uVar3 = uVar3 + 1) {
    lVar1 = *(long *)((long)val.u.ptr + 0x38);
    if ((~*(uint *)(lVar1 + lVar2) & 0xfffffffe) == 0) {
      (*mark_func)(rt,*(JSGCObjectHeader **)(lVar1 + -8 + lVar2));
    }
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

static void js_array_mark(JSRuntime *rt, JSValueConst val,
                          JS_MarkFunc *mark_func)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_MarkValue(rt, p->u.array.u.values[i], mark_func);
    }
}